

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.c
# Opt level: O2

t_pool * t_pool_init(int qsize,int tsize)

{
  pthread_mutex_t *__mutex;
  undefined8 *puVar1;
  int iVar2;
  t_pool *ptVar3;
  t_pool_worker_t *ptVar4;
  int *piVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  
  ptVar3 = (t_pool *)malloc(0x108);
  ptVar3->qsize = qsize;
  ptVar3->tsize = tsize;
  ptVar3->t_stack = (int *)0x0;
  ptVar4 = (t_pool_worker_t *)malloc((long)tsize * 0x50);
  ptVar3->njobs = 0;
  ptVar3->nwaiting = 0;
  *(undefined8 *)&ptVar3->shutdown = 0;
  ptVar3->head = (t_pool_job *)0x0;
  ptVar3->tail = (t_pool_job *)0x0;
  ptVar3->t = ptVar4;
  __mutex = &ptVar3->pool_m;
  pthread_mutex_init((pthread_mutex_t *)__mutex,(pthread_mutexattr_t *)0x0);
  pthread_cond_init((pthread_cond_t *)&ptVar3->empty_c,(pthread_condattr_t *)0x0);
  pthread_cond_init((pthread_cond_t *)&ptVar3->full_c,(pthread_condattr_t *)0x0);
  pthread_mutex_lock((pthread_mutex_t *)__mutex);
  piVar5 = (int *)malloc((long)tsize << 2);
  ptVar3->t_stack = piVar5;
  if (piVar5 != (int *)0x0) {
    ptVar3->t_stack_top = -1;
    uVar6 = (ulong)(uint)tsize;
    if (tsize < 1) {
      uVar6 = 0;
    }
    lVar7 = 0;
    uVar8 = 0;
    do {
      if (uVar6 == uVar8) {
        pthread_mutex_unlock((pthread_mutex_t *)__mutex);
        return ptVar3;
      }
      ptVar4 = ptVar3->t;
      ptVar3->t_stack[uVar8] = 0;
      puVar1 = (undefined8 *)((long)&ptVar4->p + lVar7);
      *puVar1 = ptVar3;
      *(int *)(puVar1 + 1) = (int)uVar8;
      puVar1[9] = 0;
      pthread_cond_init((pthread_cond_t *)(puVar1 + 3),(pthread_condattr_t *)0x0);
      iVar2 = pthread_create((pthread_t *)((long)&ptVar4->tid + lVar7),(pthread_attr_t *)0x0,
                             t_pool_worker,(void *)((long)&ptVar4->p + lVar7));
      uVar8 = uVar8 + 1;
      lVar7 = lVar7 + 0x50;
    } while (iVar2 == 0);
  }
  return (t_pool *)0x0;
}

Assistant:

t_pool *t_pool_init(int qsize, int tsize) {
    int i;
    t_pool *p = malloc(sizeof(*p));
    p->qsize = qsize;
    p->tsize = tsize;
    p->njobs = 0;
    p->nwaiting = 0;
    p->shutdown = 0;
    p->head = p->tail = NULL;
    p->t_stack = NULL;
#ifdef DEBUG_TIME
    p->total_time = p->wait_time = 0;
#endif

    p->t = malloc(tsize * sizeof(p->t[0]));

    pthread_mutex_init(&p->pool_m, NULL);
    pthread_cond_init(&p->empty_c, NULL);
    pthread_cond_init(&p->full_c, NULL);

    pthread_mutex_lock(&p->pool_m);

#ifdef IN_ORDER
    if (!(p->t_stack = malloc(tsize * sizeof(*p->t_stack))))
	return NULL;
    p->t_stack_top = -1;

    for (i = 0; i < tsize; i++) {
	t_pool_worker_t *w = &p->t[i];
	p->t_stack[i] = 0;
	w->p = p;
	w->idx = i;
	w->wait_time = 0;
	pthread_cond_init(&w->pending_c, NULL);
	if (0 != pthread_create(&w->tid, NULL, t_pool_worker, w))
	    return NULL;
    }
#else
    pthread_cond_init(&p->pending_c, NULL);

    for (i = 0; i < tsize; i++) {
	t_pool_worker_t *w = &p->t[i];
	w->p = p;
	w->idx = i;
	pthread_cond_init(&w->pending_c, NULL);
	if (0 != pthread_create(&w->tid, NULL, t_pool_worker, w))
	    return NULL;
    }
#endif

    pthread_mutex_unlock(&p->pool_m);

    return p;
}